

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

string * __thiscall OnDiskDataset::get_id_abi_cxx11_(OnDiskDataset *this)

{
  string *psVar1;
  path *in_RSI;
  DatabaseName *in_RDI;
  DatabaseName dbname;
  DatabaseName *this_00;
  path *in_stack_ffffffffffffff00;
  DatabaseName local_b0;
  DatabaseName *db_base;
  
  this_00 = in_RDI;
  db_base = in_RDI;
  std::experimental::filesystem::v1::__cxx11::path::path(in_stack_ffffffffffffff00,in_RSI);
  DatabaseName::parse(&db_base->db_base,&in_RSI->_M_pathname);
  std::experimental::filesystem::v1::__cxx11::path::~path(&this_00->db_base);
  psVar1 = DatabaseName::get_id_abi_cxx11_(&local_b0);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  DatabaseName::~DatabaseName(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string OnDiskDataset::get_id() const {
    // TODO(unknown): use DatabaseName as a class member instead
    auto dbname = DatabaseName::parse(db_base, name);
    return dbname.get_id();
}